

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519_64_adx.h
# Opt level: O1

void x25519_scalar_mult_adx(uint8_t *out,uint8_t *scalar,uint8_t *point)

{
  uint64_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  byte bVar12;
  byte arg1;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  fe4 t2;
  fe4 z3;
  fe4 t1;
  fe4 tmp1;
  fe4 x3;
  fe4 z2;
  fe4 x2;
  fe4 t3;
  fe4 tmp0;
  fe4 x1;
  fe4 t0;
  undefined1 local_1c8 [40];
  uint8_t *local_1a0;
  uint64_t local_198;
  long lStack_190;
  long local_188;
  long lStack_180;
  undefined1 local_178 [32];
  ulong local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  ulong uStack_140;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  uint64_t local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  ulong uStack_100;
  uint64_t local_f8 [8];
  undefined1 local_b8 [32];
  uint64_t local_98 [4];
  uint64_t local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  ulong uStack_60;
  undefined1 local_58 [40];
  
  uStack_150 = *(undefined8 *)(scalar + 8);
  local_148 = *(undefined8 *)(scalar + 0x10);
  local_158 = *(ulong *)scalar & 0xfffffffffffffff8;
  uStack_140 = *(ulong *)(scalar + 0x18) & 0x3fffffffffffffff | 0x4000000000000000;
  local_f8[6] = 0;
  local_f8[7] = 0;
  local_f8[4] = 1;
  local_f8[5] = 0;
  local_f8[2] = 0;
  local_f8[3] = 0;
  local_f8[0] = 0;
  local_f8[1] = 0;
  local_188 = 0;
  lStack_180 = 0;
  local_198 = 1;
  lStack_190 = 0;
  local_78 = *(uint64_t *)point;
  uStack_70 = *(undefined8 *)(point + 8);
  local_68 = *(undefined8 *)(point + 0x10);
  uStack_60 = *(ulong *)(point + 0x18) & 0x7fffffffffffffff;
  local_118 = *(uint64_t *)point;
  uStack_110 = *(undefined8 *)(point + 8);
  local_108 = *(undefined8 *)(point + 0x10);
  uStack_100 = uStack_60;
  uVar8 = 0xfe;
  local_1a0 = out;
  bVar12 = 0;
  do {
    arg1 = *(byte *)((long)&local_158 + (ulong)(uVar8 >> 3)) >> ((byte)uVar8 & 7) & 1;
    puVar1 = local_f8 + 4;
    fe4_cswap(puVar1,&local_118,bVar12 ^ arg1,puVar1,&local_118);
    fe4_cswap(local_f8,&local_198,bVar12 ^ arg1,local_f8,&local_198);
    fe4_sub(local_98,&local_118,&local_198);
    fe4_sub(&local_138,puVar1,local_f8);
    fe4_add(puVar1,puVar1,local_f8);
    fe4_add(local_f8,&local_118,&local_198);
    fiat_curve25519_adx_mul(&local_198,local_98,puVar1);
    fiat_curve25519_adx_mul(local_f8,local_f8,&local_138);
    fiat_curve25519_adx_square(local_98,&local_138);
    fiat_curve25519_adx_square(&local_138,puVar1);
    fe4_add(&local_118,&local_198,local_f8);
    fe4_sub(local_f8,&local_198,local_f8);
    fiat_curve25519_adx_mul(puVar1,&local_138,local_98);
    fe4_sub(&local_138,&local_138,local_98);
    fiat_curve25519_adx_square(local_f8,local_f8);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_138;
    uVar15 = SUB168(ZEXT816(0x1db42) * auVar2,0);
    uVar13 = SUB168(ZEXT816(0x1db42) * auVar2,8);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_130;
    uVar6 = SUB168(ZEXT816(0x1db42) * auVar3,0);
    uVar16 = SUB168(ZEXT816(0x1db42) * auVar3,8);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_128;
    uVar9 = SUB168(ZEXT816(0x1db42) * auVar4,0);
    uVar17 = SUB168(ZEXT816(0x1db42) * auVar4,8);
    uVar7 = uVar6 + uVar13;
    uVar6 = (ulong)CARRY8(uVar6,uVar13);
    uVar13 = uVar9 + uVar16;
    uVar10 = uVar13 + uVar6;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_120;
    uVar14 = SUB168(ZEXT816(0x1db42) * auVar5,0);
    uVar6 = (ulong)(CARRY8(uVar9,uVar16) || CARRY8(uVar13,uVar6));
    uVar13 = uVar14 + uVar17;
    uVar9 = uVar13 + uVar6;
    uVar13 = (SUB168(ZEXT816(0x1db42) * auVar5,8) +
             (ulong)(CARRY8(uVar14,uVar17) || CARRY8(uVar13,uVar6))) * 0x26;
    uVar6 = (ulong)CARRY8(uVar13,uVar15);
    lStack_190 = uVar7 + uVar6;
    uVar6 = (ulong)CARRY8(uVar7,uVar6);
    local_188 = uVar10 + uVar6;
    uVar6 = (ulong)CARRY8(uVar10,uVar6);
    lStack_180 = uVar9 + uVar6;
    local_198 = uVar13 + uVar15 + (ulong)(-(uint)CARRY8(uVar9,uVar6) & 0x26);
    fiat_curve25519_adx_square(&local_118,&local_118);
    fe4_add(local_98,local_98,&local_198);
    fiat_curve25519_adx_mul(&local_198,&local_78,local_f8);
    fiat_curve25519_adx_mul(local_f8,&local_138,local_98);
    bVar18 = uVar8 != 0;
    uVar8 = uVar8 - 1;
    bVar12 = arg1;
  } while (bVar18);
  fe4_cswap(local_f8 + 4,&local_118,arg1,local_f8 + 4,&local_118);
  fe4_cswap(local_f8,&local_198,arg1,local_f8,&local_198);
  fiat_curve25519_adx_square(local_58,local_f8);
  fiat_curve25519_adx_square(local_178,local_58);
  fiat_curve25519_adx_square(local_178,local_178);
  fiat_curve25519_adx_mul(local_178,local_f8,local_178);
  fiat_curve25519_adx_mul(local_58,local_58,local_178);
  fiat_curve25519_adx_square(local_1c8,local_58);
  fiat_curve25519_adx_mul(local_178,local_178,local_1c8);
  fiat_curve25519_adx_square(local_1c8,local_178);
  iVar11 = 4;
  do {
    fiat_curve25519_adx_square(local_1c8,local_1c8);
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  fiat_curve25519_adx_mul(local_178,local_1c8,local_178);
  fiat_curve25519_adx_square(local_1c8,local_178);
  iVar11 = 9;
  do {
    fiat_curve25519_adx_square(local_1c8,local_1c8);
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  fiat_curve25519_adx_mul(local_1c8,local_1c8,local_178);
  fiat_curve25519_adx_square(local_b8,local_1c8);
  iVar11 = 0x13;
  do {
    fiat_curve25519_adx_square(local_b8,local_b8);
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  fiat_curve25519_adx_mul(local_1c8,local_b8,local_1c8);
  fiat_curve25519_adx_square(local_1c8,local_1c8);
  iVar11 = 9;
  do {
    fiat_curve25519_adx_square(local_1c8,local_1c8);
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  fiat_curve25519_adx_mul(local_178,local_1c8,local_178);
  fiat_curve25519_adx_square(local_1c8,local_178);
  iVar11 = 0x31;
  do {
    fiat_curve25519_adx_square(local_1c8,local_1c8);
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  fiat_curve25519_adx_mul(local_1c8,local_1c8,local_178);
  fiat_curve25519_adx_square(local_b8,local_1c8);
  iVar11 = 99;
  do {
    fiat_curve25519_adx_square(local_b8,local_b8);
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  fiat_curve25519_adx_mul(local_1c8,local_b8,local_1c8);
  fiat_curve25519_adx_square(local_1c8,local_1c8);
  iVar11 = 0x31;
  do {
    fiat_curve25519_adx_square(local_1c8,local_1c8);
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  fiat_curve25519_adx_mul(local_178,local_1c8,local_178);
  fiat_curve25519_adx_square(local_178,local_178);
  iVar11 = 4;
  do {
    fiat_curve25519_adx_square(local_178,local_178);
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  fiat_curve25519_adx_mul(local_f8,local_178,local_58);
  puVar1 = local_f8 + 4;
  fiat_curve25519_adx_mul(puVar1,puVar1,local_f8);
  fe4_canon(puVar1,puVar1);
  *(uint64_t *)(local_1a0 + 0x10) = local_f8[6];
  *(uint64_t *)(local_1a0 + 0x18) = local_f8[7];
  *(uint64_t *)local_1a0 = local_f8[4];
  *(uint64_t *)(local_1a0 + 8) = local_f8[5];
  return;
}

Assistant:

__attribute__((target("adx,bmi2")))
void x25519_scalar_mult_adx(uint8_t out[32], const uint8_t scalar[32],
                            const uint8_t point[32]) {
  uint8_t e[32];
  OPENSSL_memcpy(e, scalar, 32);
  e[0] &= 248;
  e[31] &= 127;
  e[31] |= 64;

  // The following implementation was transcribed to Coq and proven to
  // correspond to unary scalar multiplication in affine coordinates given that
  // x1 != 0 is the x coordinate of some point on the curve. It was also checked
  // in Coq that doing a ladderstep with x1 = x3 = 0 gives z2' = z3' = 0, and z2
  // = z3 = 0 gives z2' = z3' = 0. The statement was quantified over the
  // underlying field, so it applies to Curve25519 itself and the quadratic
  // twist of Curve25519. It was not proven in Coq that prime-field arithmetic
  // correctly simulates extension-field arithmetic on prime-field values.
  // The decoding of the byte array representation of e was not considered.
  // Specification of Montgomery curves in affine coordinates:
  // <https://github.com/mit-plv/fiat-crypto/blob/2456d821825521f7e03e65882cc3521795b0320f/src/Spec/MontgomeryCurve.v#L27>
  // Proof that these form a group that is isomorphic to a Weierstrass curve:
  // <https://github.com/mit-plv/fiat-crypto/blob/2456d821825521f7e03e65882cc3521795b0320f/src/Curves/Montgomery/AffineProofs.v#L35>
  // Coq transcription and correctness proof of the loop (where scalarbits=255):
  // <https://github.com/mit-plv/fiat-crypto/blob/2456d821825521f7e03e65882cc3521795b0320f/src/Curves/Montgomery/XZ.v#L118>
  // <https://github.com/mit-plv/fiat-crypto/blob/2456d821825521f7e03e65882cc3521795b0320f/src/Curves/Montgomery/XZProofs.v#L278>
  // preconditions: 0 <= e < 2^255 (not necessarily e < order), fe_invert(0) = 0
  fe4 x1, x2 = {1}, z2 = {0}, x3, z3 = {1}, tmp0, tmp1;
  OPENSSL_memcpy(x1, point, sizeof(fe4));
  x1[3] &= (uint64_t)(-1)>>1;
  OPENSSL_memcpy(x3, x1, sizeof(fe4));

  unsigned swap = 0;
  int pos;
  for (pos = 254; pos >= 0; --pos) {
    // loop invariant as of right before the test, for the case where x1 != 0:
    //   pos >= -1; if z2 = 0 then x2 is nonzero; if z3 = 0 then x3 is nonzero
    //   let r := e >> (pos+1) in the following equalities of projective points:
    //   to_xz (r*P)     === if swap then (x3, z3) else (x2, z2)
    //   to_xz ((r+1)*P) === if swap then (x2, z2) else (x3, z3)
    //   x1 is the nonzero x coordinate of the nonzero point (r*P-(r+1)*P)
    unsigned b = 1 & (e[pos / 8] >> (pos & 7));
    swap ^= b;
    fe4_cswap(x2, x3, swap, x2, x3);
    fe4_cswap(z2, z3, swap, z2, z3);
    swap = b;
    // Coq transcription of ladderstep formula (called from transcribed loop):
    // <https://github.com/mit-plv/fiat-crypto/blob/2456d821825521f7e03e65882cc3521795b0320f/src/Curves/Montgomery/XZ.v#L89>
    // <https://github.com/mit-plv/fiat-crypto/blob/2456d821825521f7e03e65882cc3521795b0320f/src/Curves/Montgomery/XZProofs.v#L131>
    // x1 != 0 <https://github.com/mit-plv/fiat-crypto/blob/2456d821825521f7e03e65882cc3521795b0320f/src/Curves/Montgomery/XZProofs.v#L217>
    // x1  = 0 <https://github.com/mit-plv/fiat-crypto/blob/2456d821825521f7e03e65882cc3521795b0320f/src/Curves/Montgomery/XZProofs.v#L147>
    fe4_sub(tmp0, x3, z3);
    fe4_sub(tmp1, x2, z2);
    fe4_add(x2, x2, z2);
    fe4_add(z2, x3, z3);
    fe4_mul(z3, tmp0, x2);
    fe4_mul(z2, z2, tmp1);
    fe4_sq(tmp0, tmp1);
    fe4_sq(tmp1, x2);
    fe4_add(x3, z3, z2);
    fe4_sub(z2, z3, z2);
    fe4_mul(x2, tmp1, tmp0);
    fe4_sub(tmp1, tmp1, tmp0);
    fe4_sq(z2, z2);
    fe4_scmul(z3, tmp1, 121666);
    fe4_sq(x3, x3);
    fe4_add(tmp0, tmp0, z3);
    fe4_mul(z3, x1, z2);
    fe4_mul(z2, tmp1, tmp0);
  }
  // here pos=-1, so r=e, so to_xz (e*P) === if swap then (x3, z3) else (x2, z2)
  fe4_cswap(x2, x3, swap, x2, x3);
  fe4_cswap(z2, z3, swap, z2, z3);

  fe4_invert(z2, z2);
  fe4_mul(x2, x2, z2);
  fe4_canon(x2, x2);
  OPENSSL_memcpy(out, x2, sizeof(fe4));
}